

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3DoclistOrMerge(int bDescDoclist,char *a1,int n1,char *a2,int n2,char **paOut,int *pnOut)

{
  int iVar1;
  long lVar2;
  char *pEnd;
  int bDescIdx;
  char *pEnd_00;
  int bFirstOut;
  int local_74;
  char *p1;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  char *local_58;
  char *p2;
  sqlite3_int64 iPrev;
  char **local_40;
  char *local_38;
  
  i1 = 0;
  i2 = 0;
  iPrev = 0;
  bFirstOut = 0;
  *paOut = (char *)0x0;
  *pnOut = 0;
  local_74 = bDescDoclist;
  p1 = a1;
  p2 = a2;
  local_58 = (char *)sqlite3_malloc64((long)n1 + (long)n2 + 0x11);
  if (local_58 == (char *)0x0) {
    iVar1 = 7;
  }
  else {
    pEnd = a1 + n1;
    pEnd_00 = a2 + n2;
    local_40 = paOut;
    local_38 = local_58;
    fts3GetDeltaVarint3(&p1,pEnd,0,&i1);
    fts3GetDeltaVarint3(&p2,pEnd_00,0,&i2);
    bDescIdx = local_74;
    while( true ) {
      if (p1 == (char *)0x0 && p2 == (char *)0x0) break;
      lVar2 = -(i1 - i2);
      if (bDescIdx == 0) {
        lVar2 = i1 - i2;
      }
      if (lVar2 == 0 && (p1 != (char *)0x0 && p2 != (char *)0x0)) {
        fts3PutDeltaVarint3(&local_38,bDescIdx,&iPrev,&bFirstOut,i1);
        iVar1 = fts3PoslistMerge(&local_38,&p1,&p2);
        if (iVar1 != 0) {
          sqlite3_free(local_58);
          local_38 = (char *)0x0;
          local_58 = (char *)0x0;
          goto LAB_001a6974;
        }
        fts3GetDeltaVarint3(&p1,pEnd,bDescIdx,&i1);
        fts3GetDeltaVarint3(&p2,pEnd_00,bDescIdx,&i2);
      }
      else if ((p2 == (char *)0x0) || (p1 != (char *)0x0 && lVar2 < 0)) {
        fts3PutDeltaVarint3(&local_38,bDescIdx,&iPrev,&bFirstOut,i1);
        fts3PoslistCopy(&local_38,&p1);
        bDescIdx = local_74;
        fts3GetDeltaVarint3(&p1,pEnd,local_74,&i1);
      }
      else {
        fts3PutDeltaVarint3(&local_38,bDescIdx,&iPrev,&bFirstOut,i2);
        fts3PoslistCopy(&local_38,&p2);
        fts3GetDeltaVarint3(&p2,pEnd_00,bDescIdx,&i2);
      }
    }
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    iVar1 = 0;
LAB_001a6974:
    *local_40 = local_58;
    *pnOut = (int)local_38 - (int)local_58;
  }
  return iVar1;
}

Assistant:

static int fts3DoclistOrMerge(
  int bDescDoclist,               /* True if arguments are desc */
  char *a1, int n1,               /* First doclist */
  char *a2, int n2,               /* Second doclist */
  char **paOut, int *pnOut        /* OUT: Malloc'd doclist */
){
  int rc = SQLITE_OK;
  sqlite3_int64 i1 = 0;
  sqlite3_int64 i2 = 0;
  sqlite3_int64 iPrev = 0;
  char *pEnd1 = &a1[n1];
  char *pEnd2 = &a2[n2];
  char *p1 = a1;
  char *p2 = a2;
  char *p;
  char *aOut;
  int bFirstOut = 0;

  *paOut = 0;
  *pnOut = 0;

  /* Allocate space for the output. Both the input and output doclists
  ** are delta encoded. If they are in ascending order (bDescDoclist==0),
  ** then the first docid in each list is simply encoded as a varint. For
  ** each subsequent docid, the varint stored is the difference between the
  ** current and previous docid (a positive number - since the list is in
  ** ascending order).
  **
  ** The first docid written to the output is therefore encoded using the 
  ** same number of bytes as it is in whichever of the input lists it is
  ** read from. And each subsequent docid read from the same input list 
  ** consumes either the same or less bytes as it did in the input (since
  ** the difference between it and the previous value in the output must
  ** be a positive value less than or equal to the delta value read from 
  ** the input list). The same argument applies to all but the first docid
  ** read from the 'other' list. And to the contents of all position lists
  ** that will be copied and merged from the input to the output.
  **
  ** However, if the first docid copied to the output is a negative number,
  ** then the encoding of the first docid from the 'other' input list may
  ** be larger in the output than it was in the input (since the delta value
  ** may be a larger positive integer than the actual docid).
  **
  ** The space required to store the output is therefore the sum of the
  ** sizes of the two inputs, plus enough space for exactly one of the input
  ** docids to grow. 
  **
  ** A symetric argument may be made if the doclists are in descending 
  ** order.
  */
  aOut = sqlite3_malloc64((i64)n1+n2+FTS3_VARINT_MAX-1+FTS3_BUFFER_PADDING);
  if( !aOut ) return SQLITE_NOMEM;

  p = aOut;
  fts3GetDeltaVarint3(&p1, pEnd1, 0, &i1);
  fts3GetDeltaVarint3(&p2, pEnd2, 0, &i2);
  while( p1 || p2 ){
    sqlite3_int64 iDiff = DOCID_CMP(i1, i2);

    if( p2 && p1 && iDiff==0 ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      rc = fts3PoslistMerge(&p, &p1, &p2);
      if( rc ) break;
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }else if( !p2 || (p1 && iDiff<0) ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      fts3PoslistCopy(&p, &p1);
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
    }else{
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i2);
      fts3PoslistCopy(&p, &p2);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(aOut);
    p = aOut = 0;
  }else{
    assert( (p-aOut)<=n1+n2+FTS3_VARINT_MAX-1 );
    memset(&aOut[(p-aOut)], 0, FTS3_BUFFER_PADDING);
  }
  *paOut = aOut;
  *pnOut = (int)(p-aOut);
  return rc;
}